

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O1

_Bool mptest_swap_rows(int nrow,int ncol,m256v *Ml,m2v *Ms)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 10;
  do {
    iVar1 = rand();
    iVar2 = rand();
    m256v_swap_rows(Ml,iVar1 % nrow,iVar2 % nrow);
    m2v_swap_rows(Ms,iVar1 % nrow,iVar2 % nrow);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return true;
}

Assistant:

static bool mptest_swap_rows(int nrow, int ncol, m256v* Ml, m2v* Ms)
{
	for (int i = 0; i < 10; ++i) {
		const int r1 = rand() % nrow;
		const int r2 = rand() % nrow;

		m256v_swap_rows(Ml, r1, r2);
		m2v_swap_rows(Ms, r1, r2);
	}
	return true;
}